

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRankExtractor.hpp
# Opt level: O0

void __thiscall
cppjieba::TextRankExtractor::TextRankExtractor
          (TextRankExtractor *this,string *dictPath,string *hmmFilePath,string *stopWordPath,
          string *userDict)

{
  string *in_RCX;
  string *in_RDX;
  MixSegment *in_RSI;
  string *in_R8;
  string *in_stack_000003d8;
  TextRankExtractor *in_stack_000003e0;
  
  MixSegment::MixSegment(in_RSI,in_RDX,in_RCX,in_R8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1dde80);
  LoadStopWordDict(in_stack_000003e0,in_stack_000003d8);
  return;
}

Assistant:

TextRankExtractor(const string& dictPath, 
        const string& hmmFilePath, 
        const string& stopWordPath, 
        const string& userDict = "") 
    : segment_(dictPath, hmmFilePath, userDict) {
    LoadStopWordDict(stopWordPath);
  }